

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::WriteFloatEntry
          (ColladaExporter *this,Property *pProperty,string *pTypeName)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  ostream *poVar4;
  
  if (pProperty->exist == true) {
    puVar1 = &this->field_0x38;
    psVar2 = &this->startstr;
    poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar4 = std::operator<<(poVar4,"<");
    poVar4 = std::operator<<(poVar4,(string *)pTypeName);
    poVar4 = std::operator<<(poVar4,">");
    psVar3 = &this->endstr;
    std::operator<<(poVar4,(string *)psVar3);
    PushTag(this);
    poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar4 = std::operator<<(poVar4,"<float sid=\"");
    poVar4 = std::operator<<(poVar4,(string *)pTypeName);
    poVar4 = std::operator<<(poVar4,"\">");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pProperty->value);
    poVar4 = std::operator<<(poVar4,"</float>");
    std::operator<<(poVar4,(string *)psVar3);
    PopTag(this);
    poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar4 = std::operator<<(poVar4,"</");
    poVar4 = std::operator<<(poVar4,(string *)pTypeName);
    poVar4 = std::operator<<(poVar4,">");
    std::operator<<(poVar4,(string *)psVar3);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteFloatEntry( const Property& pProperty, const std::string& pTypeName)
{
    if(pProperty.exist) {
        mOutput << startstr << "<" << pTypeName << ">" << endstr;
        PushTag();
        mOutput << startstr << "<float sid=\"" << pTypeName << "\">" << pProperty.value << "</float>" << endstr;
        PopTag();
        mOutput << startstr << "</" << pTypeName << ">" << endstr;
    }
}